

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

const_reference __thiscall
google::protobuf::RepeatedField<unsigned_int>::Get(RepeatedField<unsigned_int> *this,int index)

{
  int new_size;
  ulong uVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  uint *puVar4;
  int *piVar5;
  const_reference puVar6;
  int *piVar7;
  bool is_soo;
  LongSooRep *this_00;
  bool is_soo_00;
  bool bVar8;
  int iStack_60;
  
  this_00 = (LongSooRep *)(ulong)(uint)index;
  if (index < 0) {
    Get();
    iVar2 = extraout_EAX;
  }
  else {
    iVar2 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar2) {
      puVar4 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return puVar4 + (long)this_00;
    }
  }
  Get();
  uVar1 = this_00->elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar3 = internal::SooRep::size((SooRep *)this_00,is_soo_00);
  iStack_60 = 2;
  if ((uVar1 & 4) == 0) {
    piVar7 = &this_00->size;
  }
  else {
    iStack_60 = this_00->capacity;
    piVar7 = (int *)internal::LongSooRep::elements(this_00);
  }
  new_size = iVar3 + 1;
  bVar8 = iVar3 == iStack_60;
  if (bVar8) {
    Grow((RepeatedField<unsigned_int> *)this_00,(uVar1 & 4) == 0,iVar3,new_size);
    iStack_60 = this_00->capacity;
    piVar7 = (int *)internal::LongSooRep::elements(this_00);
  }
  bVar8 = !bVar8;
  is_soo = bVar8 && is_soo_00;
  iVar3 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if ((iVar3 != new_size) && ((this_00->elements_int & 4) != 0)) {
    internal::LongSooRep::elements(this_00);
  }
  set_size((RepeatedField<unsigned_int> *)this_00,is_soo,new_size);
  piVar7[iVar3] = iVar2;
  if (is_soo != ((this_00->elements_int & 4) == 0)) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35b);
  }
  iVar2 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if (new_size != iVar2) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35d);
  }
  if (bVar8 && is_soo_00) {
    piVar5 = &this_00->size;
  }
  else {
    piVar5 = (int *)internal::LongSooRep::elements(this_00);
  }
  if (piVar7 != piVar5) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35f);
  }
  puVar6 = (const_reference)0x2;
  if (!bVar8 || !is_soo_00) {
    puVar6 = (const_reference)(ulong)(uint)this_00->capacity;
  }
  if (iStack_60 != (int)puVar6) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x361);
  }
  return puVar6;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return elements(is_soo())[index];
}